

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O3

uchar * Cnf_DataDeriveLitPolarities(Cnf_Dat_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int **ppiVar5;
  uint *puVar6;
  long lVar7;
  void *__ptr;
  void *__ptr_00;
  uchar *puVar8;
  uint *puVar9;
  uint *puVar10;
  long lVar11;
  ulong uVar12;
  void *pvVar13;
  size_t sVar14;
  long lVar15;
  long lVar16;
  size_t __nmemb;
  
  __nmemb = (size_t)p->pMan->vObjs->nSize;
  __ptr = calloc(__nmemb,4);
  __ptr_00 = calloc(__nmemb,4);
  puVar8 = (uchar *)calloc((long)p->nClauses,1);
  if (0 < (long)__nmemb) {
    piVar4 = p->pObj2Count;
    sVar14 = 0;
    do {
      iVar1 = piVar4[sVar14];
      if (((long)iVar1 != 0) && (0 < iVar1)) {
        lVar15 = (long)p->pObj2Clause[sVar14];
        lVar11 = iVar1 + lVar15;
        ppiVar5 = p->pClauses;
        puVar10 = (uint *)ppiVar5[lVar15];
        lVar16 = lVar15;
        do {
          puVar6 = (uint *)ppiVar5[lVar16 + 1];
          puVar9 = puVar10 + 1;
          if (puVar9 < puVar6) {
            uVar2 = *puVar10;
            if ((int)uVar2 < 0) goto LAB_005650df;
            do {
              uVar3 = *puVar9;
              pvVar13 = __ptr;
              if ((uVar2 & 1) == 0) {
                pvVar13 = __ptr_00;
              }
              if ((int)uVar3 < 0) goto LAB_005650df;
              puVar10 = (uint *)((long)pvVar13 + (ulong)(uVar3 >> 1) * 4);
              *puVar10 = *puVar10 | 2 - (uVar3 & 1);
              puVar9 = puVar9 + 1;
            } while (puVar9 < puVar6);
          }
          lVar16 = lVar16 + 1;
          puVar10 = puVar6;
        } while (lVar16 < lVar11);
        if (0 < iVar1) {
          ppiVar5 = p->pClauses;
          lVar11 = (long)(int)lVar11;
          puVar10 = (uint *)ppiVar5[lVar15];
          lVar16 = lVar15;
          do {
            puVar9 = (uint *)ppiVar5[lVar16 + 1];
            if (puVar10 + 1 < puVar9) {
              uVar2 = *puVar10;
              if ((int)uVar2 < 0) {
LAB_005650df:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              uVar12 = 4;
              do {
                pvVar13 = __ptr;
                if ((uVar2 & 1) == 0) {
                  pvVar13 = __ptr_00;
                }
                if ((int)*(uint *)((long)puVar10 + uVar12) < 0) goto LAB_005650fe;
                puVar8[lVar16] =
                     puVar8[lVar16] |
                     (byte)(*(int *)((long)pvVar13 +
                                    (ulong)(*(uint *)((long)puVar10 + uVar12) >> 1) * 4) <<
                           ((char)(uVar12 >> 1) - 2U & 0x1f));
                lVar7 = uVar12 + 4;
                uVar12 = uVar12 + 4;
              } while ((uint *)((long)puVar10 + lVar7) < puVar9);
            }
            lVar16 = lVar16 + 1;
            puVar10 = puVar9;
          } while (lVar16 < lVar11);
          if (0 < iVar1) {
            ppiVar5 = p->pClauses;
            puVar10 = (uint *)ppiVar5[lVar15];
            do {
              puVar9 = (uint *)ppiVar5[lVar15 + 1];
              while (puVar10 = puVar10 + 1, puVar10 < puVar9) {
                if ((int)*puVar10 < 0) {
LAB_005650fe:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                uVar12 = (ulong)(*puVar10 >> 1);
                *(undefined4 *)((long)__ptr_00 + uVar12 * 4) = 0;
                *(undefined4 *)((long)__ptr + uVar12 * 4) = 0;
              }
              lVar15 = lVar15 + 1;
              puVar10 = puVar9;
            } while (lVar15 < lVar11);
          }
        }
      }
      sVar14 = sVar14 + 1;
    } while (sVar14 != __nmemb);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  return puVar8;
}

Assistant:

unsigned char * Cnf_DataDeriveLitPolarities( Cnf_Dat_t * p )
{
    int i, c, iClaBeg, iClaEnd, * pLit;
    unsigned * pPols0 = ABC_CALLOC( unsigned, Aig_ManObjNumMax(p->pMan) );
    unsigned * pPols1 = ABC_CALLOC( unsigned, Aig_ManObjNumMax(p->pMan) );
    unsigned char * pPres = ABC_CALLOC( unsigned char, p->nClauses );
    for ( i = 0; i < Aig_ManObjNumMax(p->pMan); i++ )
    {
        if ( p->pObj2Count[i] == 0 )
            continue;
        iClaBeg = p->pObj2Clause[i];
        iClaEnd = p->pObj2Clause[i] + p->pObj2Count[i];
        // go through the negative polarity clauses
        for ( c = iClaBeg; c < iClaEnd; c++ )
            for ( pLit = p->pClauses[c]+1; pLit < p->pClauses[c+1]; pLit++ )
                if ( Abc_LitIsCompl(p->pClauses[c][0]) )
                    pPols0[Abc_Lit2Var(*pLit)] |= (unsigned)(2 - Abc_LitIsCompl(*pLit));  // taking the opposite (!) -- not the case
                else
                    pPols1[Abc_Lit2Var(*pLit)] |= (unsigned)(2 - Abc_LitIsCompl(*pLit));  // taking the opposite (!) -- not the case
        // record these clauses
        for ( c = iClaBeg; c < iClaEnd; c++ )
            for ( pLit = p->pClauses[c]+1; pLit < p->pClauses[c+1]; pLit++ )
                if ( Abc_LitIsCompl(p->pClauses[c][0]) )
                    pPres[c] = (unsigned char)( (unsigned)pPres[c] | (pPols0[Abc_Lit2Var(*pLit)] << (2*(pLit-p->pClauses[c]-1))) );
                else
                    pPres[c] = (unsigned char)( (unsigned)pPres[c] | (pPols1[Abc_Lit2Var(*pLit)] << (2*(pLit-p->pClauses[c]-1))) );
        // clean negative polarity
        for ( c = iClaBeg; c < iClaEnd; c++ )
            for ( pLit = p->pClauses[c]+1; pLit < p->pClauses[c+1]; pLit++ )
                pPols0[Abc_Lit2Var(*pLit)] = pPols1[Abc_Lit2Var(*pLit)] = 0;
    }
    ABC_FREE( pPols0 );
    ABC_FREE( pPols1 );
/*
//    for ( c = 0; c < p->nClauses; c++ )
    for ( c = 0; c < 100; c++ )
    {
        printf( "Clause %6d : ", c );
        for ( i = 0; i < 4; i++ )
            printf( "%d ", ((unsigned)pPres[c] >> (2*i)) & 3 );
        printf( "  " );
        for ( pLit = p->pClauses[c]; pLit < p->pClauses[c+1]; pLit++ )
            printf( "%6d ", *pLit );
        printf( "\n" );
    }
*/
    return pPres;
}